

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_xdr.h
# Opt level: O0

void priv_from_native(void *ptr,int n,size_t eltsize)

{
  long in_RDX;
  int in_ESI;
  void *in_RDI;
  
  if (in_RDX == 8) {
    priv_from_native64(in_RDI,in_ESI);
  }
  else if (in_RDX == 4) {
    priv_from_native32(in_RDI,in_ESI);
  }
  else if (in_RDX == 2) {
    priv_from_native16(in_RDI,in_ESI);
  }
  return;
}

Assistant:

static inline void
priv_from_native (void* ptr, int n, size_t eltsize)
{
    if (eltsize == 8)
        priv_from_native64 (ptr, n);
    else if (eltsize == 4)
        priv_from_native32 (ptr, n);
    else if (eltsize == 2)
        priv_from_native16 (ptr, n);
}